

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataRefs.cpp
# Opt level: O3

bool __thiscall DataRefs::SaveConfigFile(DataRefs *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  pointer pCVar3;
  int *piVar4;
  ostream *poVar5;
  size_t sVar6;
  bool bVar7;
  string *s;
  pointer pbVar8;
  long lVar9;
  char *pcVar10;
  size_t i;
  CSLPathCfgTy *cslPath;
  pointer pCVar11;
  char sErr [100];
  string sFileName;
  ofstream fOut;
  char local_2c1;
  DataRefs *local_2c0;
  string local_2b8 [3];
  string local_250;
  undefined1 local_230 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  byte abStack_210 [216];
  ios_base local_138 [264];
  
  local_2c0 = this;
  local_230._0_8_ = &local_220;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_230,"Output/preferences/LiveTraffic.prf","");
  LTCalcFullPath(&local_250,(string *)local_230);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._0_8_ != &local_220) {
    operator_delete((void *)local_230._0_8_,local_220._M_allocated_capacity + 1);
  }
  std::ofstream::ofstream(local_230,(string *)&local_250,_S_trunc|_S_out);
  if ((abStack_210[*(long *)(local_230._0_8_ + -0x18)] & 5) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"LiveTraffic",0xb);
    local_2b8[0]._M_dataplus._M_p._0_1_ = 0x20;
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_230,(char *)local_2b8,1);
    sVar6 = strlen(LT_VERSION);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,LT_VERSION,sVar6);
    local_2b8[0]._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)local_2b8,1);
    paVar1 = &local_2b8[0].field_2;
    lVar9 = 0;
    do {
      if ((&DATA_REFS_LT[0].bCfgFile)[lVar9] == true) {
        dataRefDefinitionT::GetConfigString_abi_cxx11_
                  (local_2b8,
                   (dataRefDefinitionT *)((long)&DATA_REFS_LT[0].dataName._M_dataplus._M_p + lVar9))
        ;
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_230,
                            (char *)CONCAT71(local_2b8[0]._M_dataplus._M_p._1_7_,
                                             local_2b8[0]._M_dataplus._M_p._0_1_),
                            local_2b8[0]._M_string_length);
        local_2c1 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_2c1,1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_2b8[0]._M_dataplus._M_p._1_7_,local_2b8[0]._M_dataplus._M_p._0_1_) !=
            paVar1) {
          operator_delete((undefined1 *)
                          CONCAT71(local_2b8[0]._M_dataplus._M_p._1_7_,
                                   local_2b8[0]._M_dataplus._M_p._0_1_),
                          local_2b8[0].field_2._M_allocated_capacity + 1);
        }
      }
      lVar9 = lVar9 + 0x60;
    } while (lVar9 != 0x29a0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"MessageWndPos",0xd);
    local_2b8[0]._M_dataplus._M_p._0_1_ = 0x20;
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_230,(char *)local_2b8,1);
    poVar5 = operator<<(poVar5,&local_2c0->MsgRect);
    local_2b8[0]._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)local_2b8,1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"SettingsWndPos",0xe);
    local_2b8[0]._M_dataplus._M_p._0_1_ = 0x20;
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_230,(char *)local_2b8,1);
    poVar5 = operator<<(poVar5,&local_2c0->SUIrect);
    local_2b8[0]._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)local_2b8,1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"ACInfoWndPos",0xc);
    local_2b8[0]._M_dataplus._M_p._0_1_ = 0x20;
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_230,(char *)local_2b8,1);
    poVar5 = operator<<(poVar5,&local_2c0->ACIrect);
    local_2b8[0]._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)local_2b8,1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"InfoListWndPos",0xe);
    local_2b8[0]._M_dataplus._M_p._0_1_ = 0x20;
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_230,(char *)local_2b8,1);
    poVar5 = operator<<(poVar5,&local_2c0->ILWrect);
    local_2b8[0]._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)local_2b8,1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"DEFAULT_AC_TYPE",0xf);
    local_2b8[0]._M_dataplus._M_p._0_1_ = 0x20;
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_230,(char *)local_2b8,1);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(local_2c0->sDefaultAcIcaoType)._M_dataplus._M_p,
                        (local_2c0->sDefaultAcIcaoType)._M_string_length);
    local_2b8[0]._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)local_2b8,1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"DEFAULT_CAR_TYPE",0x10)
    ;
    local_2b8[0]._M_dataplus._M_p._0_1_ = 0x20;
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_230,(char *)local_2b8,1);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(local_2c0->sDefaultCarIcaoType)._M_dataplus._M_p,
                        (local_2c0->sDefaultCarIcaoType)._M_string_length);
    local_2b8[0]._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)local_2b8,1);
    if ((local_2c0->sOpenSkyUser)._M_string_length != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"OpenSky_User",0xc);
      local_2b8[0]._M_dataplus._M_p._0_1_ = 0x20;
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_230,(char *)local_2b8,1);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(local_2c0->sOpenSkyUser)._M_dataplus._M_p,
                          (local_2c0->sOpenSkyUser)._M_string_length);
      local_2b8[0]._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)local_2b8,1);
    }
    if ((local_2c0->sOpenSkyPwd)._M_string_length != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"OpenSky_Pwd",0xb);
      local_2b8[0]._M_dataplus._M_p._0_1_ = 0x20;
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_230,(char *)local_2b8,1);
      Obfuscate(local_2b8,&local_2c0->sOpenSkyPwd);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(char *)CONCAT71(local_2b8[0]._M_dataplus._M_p._1_7_,
                                                  local_2b8[0]._M_dataplus._M_p._0_1_),
                          local_2b8[0]._M_string_length);
      local_2c1 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_2c1,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_2b8[0]._M_dataplus._M_p._1_7_,local_2b8[0]._M_dataplus._M_p._0_1_) !=
          paVar1) {
        operator_delete((undefined1 *)
                        CONCAT71(local_2b8[0]._M_dataplus._M_p._1_7_,
                                 local_2b8[0]._M_dataplus._M_p._0_1_),
                        local_2b8[0].field_2._M_allocated_capacity + 1);
      }
    }
    if ((local_2c0->sADSBExAPIKey)._M_string_length != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"ADSBEX_API_KEY",0xe);
      local_2b8[0]._M_dataplus._M_p._0_1_ = 0x20;
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_230,(char *)local_2b8,1);
      Obfuscate(local_2b8,&local_2c0->sADSBExAPIKey);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(char *)CONCAT71(local_2b8[0]._M_dataplus._M_p._1_7_,
                                                  local_2b8[0]._M_dataplus._M_p._0_1_),
                          local_2b8[0]._M_string_length);
      local_2c1 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_2c1,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_2b8[0]._M_dataplus._M_p._1_7_,local_2b8[0]._M_dataplus._M_p._0_1_) !=
          paVar1) {
        operator_delete((undefined1 *)
                        CONCAT71(local_2b8[0]._M_dataplus._M_p._1_7_,
                                 local_2b8[0]._M_dataplus._M_p._0_1_),
                        local_2b8[0].field_2._M_allocated_capacity + 1);
      }
    }
    if ((local_2c0->sRTLicense)._M_string_length != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_230,"RealTraffic_License",0x13);
      local_2b8[0]._M_dataplus._M_p._0_1_ = 0x20;
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_230,(char *)local_2b8,1);
      Obfuscate(local_2b8,&local_2c0->sRTLicense);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(char *)CONCAT71(local_2b8[0]._M_dataplus._M_p._1_7_,
                                                  local_2b8[0]._M_dataplus._M_p._0_1_),
                          local_2b8[0]._M_string_length);
      local_2c1 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_2c1,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_2b8[0]._M_dataplus._M_p._1_7_,local_2b8[0]._M_dataplus._M_p._0_1_) !=
          paVar1) {
        operator_delete((undefined1 *)
                        CONCAT71(local_2b8[0]._M_dataplus._M_p._1_7_,
                                 local_2b8[0]._M_dataplus._M_p._0_1_),
                        local_2b8[0].field_2._M_allocated_capacity + 1);
      }
    }
    if ((local_2c0->sFSCUser)._M_string_length != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"FSC_User",8);
      local_2b8[0]._M_dataplus._M_p._0_1_ = 0x20;
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_230,(char *)local_2b8,1);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(local_2c0->sFSCUser)._M_dataplus._M_p,
                          (local_2c0->sFSCUser)._M_string_length);
      local_2b8[0]._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)local_2b8,1);
    }
    if ((local_2c0->sFSCPwd)._M_string_length != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"FSC_Pwd",7);
      local_2b8[0]._M_dataplus._M_p._0_1_ = 0x20;
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_230,(char *)local_2b8,1);
      Obfuscate(local_2b8,&local_2c0->sFSCPwd);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(char *)CONCAT71(local_2b8[0]._M_dataplus._M_p._1_7_,
                                                  local_2b8[0]._M_dataplus._M_p._0_1_),
                          local_2b8[0]._M_string_length);
      local_2c1 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_2c1,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_2b8[0]._M_dataplus._M_p._1_7_,local_2b8[0]._M_dataplus._M_p._0_1_) !=
          paVar1) {
        operator_delete((undefined1 *)
                        CONCAT71(local_2b8[0]._M_dataplus._M_p._1_7_,
                                 local_2b8[0]._M_dataplus._M_p._0_1_),
                        local_2b8[0].field_2._M_allocated_capacity + 1);
      }
    }
    if ((local_2c0->sSIDisplayName)._M_string_length != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"SI_DisplayName",0xe);
      local_2b8[0]._M_dataplus._M_p._0_1_ = 0x20;
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_230,(char *)local_2b8,1);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(local_2c0->sSIDisplayName)._M_dataplus._M_p,
                          (local_2c0->sSIDisplayName)._M_string_length);
      local_2b8[0]._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)local_2b8,1);
    }
    local_2b8[0]._M_dataplus._M_p._0_1_ = 10;
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_230,(char *)local_2b8,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"[FlarmAcTypes]",0xe);
    local_2b8[0]._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)local_2b8,1);
    lVar9 = 0;
    do {
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)local_230);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," =",2);
      pbVar2 = dataRefs.aFlarmToIcaoAcTy._M_elems[lVar9].
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar8 = dataRefs.aFlarmToIcaoAcTy._M_elems[lVar9].
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar8 != pbVar2; pbVar8 = pbVar8 + 1
          ) {
        local_2b8[0]._M_dataplus._M_p._0_1_ = 0x20;
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_230,(char *)local_2b8,1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,(pbVar8->_M_dataplus)._M_p,pbVar8->_M_string_length);
      }
      local_2b8[0]._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,(char *)local_2b8,1);
      lVar9 = lVar9 + 1;
    } while (lVar9 != 0xe);
    if ((local_2c0->vCSLPaths).
        super__Vector_base<DataRefs::CSLPathCfgTy,_std::allocator<DataRefs::CSLPathCfgTy>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (local_2c0->vCSLPaths).
        super__Vector_base<DataRefs::CSLPathCfgTy,_std::allocator<DataRefs::CSLPathCfgTy>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_2b8[0]._M_dataplus._M_p._0_1_ = 10;
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_230,(char *)local_2b8,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"[CSLPaths]",10);
      local_2b8[0]._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)local_2b8,1);
      pCVar11 = (local_2c0->vCSLPaths).
                super__Vector_base<DataRefs::CSLPathCfgTy,_std::allocator<DataRefs::CSLPathCfgTy>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pCVar3 = (local_2c0->vCSLPaths).
               super__Vector_base<DataRefs::CSLPathCfgTy,_std::allocator<DataRefs::CSLPathCfgTy>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (pCVar11 != pCVar3) {
        do {
          if ((pCVar11->path)._M_string_length != 0) {
            pcVar10 = "0|";
            if (pCVar11->bEnabled != false) {
              pcVar10 = "1|";
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,pcVar10,2);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_230,(pCVar11->path)._M_dataplus._M_p,
                                (pCVar11->path)._M_string_length);
            local_2b8[0]._M_dataplus._M_p._0_1_ = 10;
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)local_2b8,1);
          }
          pCVar11 = pCVar11 + 1;
        } while (pCVar11 != pCVar3);
      }
    }
    if ((abStack_210[*(long *)(local_230._0_8_ + -0x18)] & 5) == 0) {
      std::ostream::flush();
      bVar7 = true;
      std::ofstream::close();
      goto LAB_0012fe3d;
    }
    piVar4 = __errno_location();
    strerror_r(*piVar4,(char *)local_2b8,100);
    if ((int)dataRefs.iLogLevel < 4) {
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/DataRefs.cpp"
             ,0x95b,"SaveConfigFile",logERR,"Could not write into config file \'%s\': %s",
             local_250._M_dataplus._M_p,local_2b8);
    }
    CreateMsgWindow(12.0,logERR,"Could not write into config file \'%s\': %s",
                    local_250._M_dataplus._M_p,local_2b8);
    std::ofstream::close();
  }
  else {
    piVar4 = __errno_location();
    strerror_r(*piVar4,(char *)local_2b8,100);
    if ((int)dataRefs.iLogLevel < 4) {
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/DataRefs.cpp"
             ,0x91d,"SaveConfigFile",logERR,"Could not create config file \'%s\': %s",
             local_250._M_dataplus._M_p,local_2b8);
    }
    CreateMsgWindow(12.0,logERR,"Could not create config file \'%s\': %s",local_250._M_dataplus._M_p
                    ,local_2b8);
  }
  bVar7 = false;
LAB_0012fe3d:
  local_230._0_8_ = _VTT;
  *(undefined8 *)(local_230 + *(long *)(_VTT + -0x18)) = _strtod;
  std::filebuf::~filebuf((filebuf *)(local_230 + 8));
  std::ios_base::~ios_base(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  return bVar7;
}

Assistant:

bool DataRefs::SaveConfigFile()
{
    // open an output config file
    std::string sFileName (LTCalcFullPath(PATH_CONFIG_FILE));
    std::ofstream fOut (sFileName, std::ios_base::out | std::ios_base::trunc);
    if (!fOut) {
		char sErr[SERR_LEN];
		strerror_s(sErr, sizeof(sErr), errno);
		SHOW_MSG(logERR, ERR_CFG_FILE_OPEN_OUT,
                 sFileName.c_str(), sErr);
        return false;
    }
    
    // *** VERSION ***
    // save application and version first
    fOut << LIVE_TRAFFIC << ' ' << LT_VERSION << '\n';
    
    // *** DataRefs ***
    // loop over our LiveTraffic values and store those meant to be stored
    for (const DataRefs::dataRefDefinitionT& def: DATA_REFS_LT)
        if (def.isCfgFile())                   // only for values which are to be saved
            fOut << def.GetConfigString() << '\n';
    
    // *** Window positions ***
    fOut << CFG_WNDPOS_MSG << ' ' << MsgRect << '\n';
    fOut << CFG_WNDPOS_SUI << ' ' << SUIrect << '\n';
    fOut << CFG_WNDPOS_ACI << ' ' << ACIrect << '\n';
    fOut << CFG_WNDPOS_ILW << ' ' << ILWrect << '\n';
    
    // *** Strings ***
    fOut << CFG_DEFAULT_AC_TYPE << ' ' << GetDefaultAcIcaoType() << '\n';
    fOut << CFG_DEFAULT_CAR_TYPE << ' ' << GetDefaultCarIcaoType() << '\n';
    if (!sOpenSkyUser.empty())
        fOut << CFG_OPENSKY_USER << ' ' << sOpenSkyUser << '\n';
    if (!sOpenSkyPwd.empty())
        fOut << CFG_OPENSKY_PWD << ' ' << Obfuscate(sOpenSkyPwd) << '\n';
    if (!GetADSBExAPIKey().empty())
        fOut << CFG_ADSBEX_API_KEY << ' ' << Obfuscate(GetADSBExAPIKey()) << '\n';
    if (!GetRTLicense().empty())
        fOut << CFG_RT_LICENSE << ' ' << Obfuscate(GetRTLicense()) << '\n';
    if (!sFSCUser.empty())
        fOut << CFG_FSC_USER << ' ' << sFSCUser << '\n';
    if (!sFSCPwd.empty())
        fOut << CFG_FSC_PWD << ' ' << Obfuscate(sFSCPwd) << '\n';
    if (!sSIDisplayName.empty())
        fOut << CFG_SI_DISPLAYNAME << ' ' << sSIDisplayName << '\n';

    // *** [FlarmAcTypes] ***
    fOut << '\n' << CFG_FLARM_ACTY_SECTION << '\n';
    for (size_t i = 0; i < dataRefs.aFlarmToIcaoAcTy.size(); i++) {
        fOut << i << " =";
        for (const std::string& s: dataRefs.aFlarmToIcaoAcTy[i])
            fOut << ' ' << s;
        fOut << '\n';
    }

    // *** [CSLPatchs] ***
    // add section of CSL paths to the end
    if (!vCSLPaths.empty()) {
        fOut << '\n' << CFG_CSL_SECTION << '\n';
        for (const DataRefs::CSLPathCfgTy& cslPath: vCSLPaths)
            if (!cslPath.empty())
                fOut << (cslPath.enabled() ? "1|" : "0|") <<
                cslPath.getPath() << '\n';
    }
    
    // some error checking towards the end
    if (!fOut) {
        char sErr[SERR_LEN];
        strerror_s(sErr, sizeof(sErr), errno);
        SHOW_MSG(logERR, ERR_CFG_FILE_WRITE,
                 sFileName.c_str(), sErr);
        fOut.close();
        return false;
    }

    // flush (which we explicitely did not do for each line for performance reasons) and close
    fOut.flush();
    fOut.close();
        
    return true;
}